

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

json_token * find_json_token(json_token *toks,char *path)

{
  char cVar1;
  int iVar2;
  int i;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  if ((path == (char *)0x0) || (cVar1 = *path, cVar1 == '\0')) {
    return (json_token *)0x0;
  }
  do {
    uVar4 = 0;
    cVar7 = cVar1;
    while (((cVar7 != '\0' && (cVar7 != '.')) && (cVar7 != '['))) {
      lVar12 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      cVar7 = path[lVar12];
    }
    if (cVar1 == '[') {
      if (toks->type != JSON_TYPE_ARRAY) {
        return (json_token *)0x0;
      }
      uVar8 = (uint)path[1];
      if (uVar8 - 0x3a < 0xfffffff6) {
        return (json_token *)0x0;
      }
      iVar5 = 0;
      uVar4 = 2;
      while( true ) {
        if ((char)uVar8 == '\0') {
          return (json_token *)0x0;
        }
        if ((uVar8 & 0xff) == 0x5d) break;
        uVar8 = (int)(char)uVar8 - 0x30;
        if (9 < uVar8) {
          return (json_token *)0x0;
        }
        iVar5 = uVar8 + iVar5 * 10;
        uVar8 = (uint)(byte)path[uVar4];
        uVar4 = uVar4 + 1;
      }
      iVar9 = 1;
    }
    else {
      if (toks->type != JSON_TYPE_OBJECT) {
        return (json_token *)0x0;
      }
      iVar9 = 2;
      iVar5 = -1;
    }
    iVar2 = toks->num_desc;
    iVar3 = (int)uVar4;
    if (iVar2 < 1) {
      iVar10 = 0;
    }
    else {
      iVar6 = 0;
      iVar10 = 0;
      do {
        if (iVar5 == -1) {
          if (toks[(long)iVar10 + 1].type != JSON_TYPE_STRING) {
            return (json_token *)0x0;
          }
          if (toks[(long)iVar10 + 1].len == iVar3) {
            if (iVar3 < 1) {
              uVar11 = 0;
            }
            else {
              uVar11 = 0;
              while (path[uVar11] == toks[(long)iVar10 + 1].ptr[uVar11]) {
                uVar11 = uVar11 + 1;
                if ((uVar4 & 0xffffffff) == uVar11) goto LAB_00106925;
              }
            }
            if ((int)uVar11 == iVar3) goto LAB_00106925;
          }
        }
        else if (iVar6 == iVar5) {
LAB_00106925:
          iVar10 = iVar9 + -1 + iVar10;
          break;
        }
        lVar12 = (long)(iVar9 + -1 + iVar10);
        if ((toks[lVar12 + 1].type | JSON_TYPE_TRUE) == JSON_TYPE_ARRAY) {
          iVar10 = iVar10 + toks[lVar12 + 1].num_desc;
        }
        iVar10 = iVar10 + iVar9;
        iVar6 = iVar6 + 1;
      } while (iVar10 < iVar2);
    }
    if (iVar10 == iVar2) {
      return (json_token *)0x0;
    }
    cVar1 = path[(ulong)(path[iVar3] == '.') + (long)iVar3];
    toks = toks + (long)iVar10 + 1;
    path = path + (ulong)(path[iVar3] == '.') + (long)iVar3;
    if (cVar1 == '\0') {
      return toks;
    }
  } while( true );
}

Assistant:

struct json_token *find_json_token(struct json_token *toks, const char *path) {
    while (path != 0 && path[0] != '\0') {
        int i, ind2 = 0, ind = -1, skip = 2, n = path_part_len(path);
        if (path[0] == '[') {
            if (toks->type != JSON_TYPE_ARRAY || !is_digit(path[1])) return 0;
            for (ind = 0, n = 1; path[n] != ']' && path[n] != '\0'; n++) {
                if (!is_digit(path[n])) return 0;
                ind *= 10;
                ind += path[n] - '0';
            }
            if (path[n++] != ']') return 0;
            skip = 1;  /* In objects, we skip 2 elems while iterating, in arrays 1. */
        } else if (toks->type != JSON_TYPE_OBJECT) return 0;
        toks++;
        for (i = 0; i < toks[-1].num_desc; i += skip, ind2++) {
            /* ind == -1 indicated that we're iterating an array, not object */
            if (ind == -1 && toks[i].type != JSON_TYPE_STRING) return 0;
            if (ind2 == ind ||
                (ind == -1 && toks[i].len == n && compare(path, toks[i].ptr, n))) {
                i += skip - 1;
                break;
            };
            if (toks[i - 1 + skip].type == JSON_TYPE_ARRAY ||
                toks[i - 1 + skip].type == JSON_TYPE_OBJECT) {
                i += toks[i - 1 + skip].num_desc;
            }
        }
        if (i == toks[-1].num_desc) return 0;
        path += n;
        if (path[0] == '.') path++;
        if (path[0] == '\0') return &toks[i];
        toks += i;
    }
    return 0;
}